

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O2

void Handlers::StatSkill_Junk(Character *character,PacketReader *reader)

{
  PacketBuilder builder;
  
  if (character->npc_type == Skills) {
    Character::Reset(character);
    PacketBuilder::PacketBuilder(&builder,PACKET_STATSKILL,PACKET_JUNK,0x24);
    PacketBuilder::AddShort(&builder,character->statpoints);
    PacketBuilder::AddShort(&builder,character->skillpoints);
    PacketBuilder::AddShort(&builder,character->hp);
    PacketBuilder::AddShort(&builder,character->maxhp);
    PacketBuilder::AddShort(&builder,character->tp);
    PacketBuilder::AddShort(&builder,character->maxtp);
    PacketBuilder::AddShort(&builder,character->maxsp);
    PacketBuilder::AddShort(&builder,*character->display_str);
    PacketBuilder::AddShort(&builder,*character->display_intl);
    PacketBuilder::AddShort(&builder,*character->display_wis);
    PacketBuilder::AddShort(&builder,*character->display_agi);
    PacketBuilder::AddShort(&builder,*character->display_con);
    PacketBuilder::AddShort(&builder,*character->display_cha);
    PacketBuilder::AddShort(&builder,character->mindam);
    PacketBuilder::AddShort(&builder,character->maxdam);
    PacketBuilder::AddShort(&builder,character->accuracy);
    PacketBuilder::AddShort(&builder,character->evade);
    PacketBuilder::AddShort(&builder,character->armor);
    Character::Send(character,&builder);
    PacketBuilder::~PacketBuilder(&builder);
  }
  return;
}

Assistant:

void StatSkill_Junk(Character *character, PacketReader &reader)
{
	(void)reader;
	/*int shopid = reader.GetInt();*/

	if (character->npc_type == ENF::Skills)
	{
		character->Reset();

		PacketBuilder builder(PACKET_STATSKILL, PACKET_JUNK, 36);
		builder.AddShort(character->statpoints);
		builder.AddShort(character->skillpoints);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->tp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->maxsp);
		builder.AddShort(character->display_str);
		builder.AddShort(character->display_intl);
		builder.AddShort(character->display_wis);
		builder.AddShort(character->display_agi);
		builder.AddShort(character->display_con);
		builder.AddShort(character->display_cha);
		builder.AddShort(character->mindam);
		builder.AddShort(character->maxdam);
		builder.AddShort(character->accuracy);
		builder.AddShort(character->evade);
		builder.AddShort(character->armor);

		character->Send(builder);
	}
}